

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

void __thiscall tetgenmesh::makesegmentendpointsmap(tetgenmesh *this)

{
  shellface ppdVar1;
  tetgenio *ptVar2;
  tetgenmesh *this_00;
  shellface *pppdVar3;
  point *ppdVar4;
  memorypool *pmVar5;
  int *piVar6;
  int iVar7;
  long lVar8;
  tetgenmesh *this_01;
  memorypool *pmVar9;
  shellface ppdVar10;
  memorypool *pmVar11;
  bool bVar12;
  undefined8 *local_38;
  
  if (0 < this->b->verbose) {
    puts("  Creating the segment-endpoints map.");
  }
  this_00 = (tetgenmesh *)operator_new(0x30);
  this_00->in = (tetgenio *)0x40000000010;
  this_00->addin = (tetgenio *)0x3ff0000000a;
  *(int *)&this_00->b = 0;
  this_00->bgm = (tetgenmesh *)0x0;
  this_00->tetrahedrons = (memorypool *)0x0;
  this_00->subfaces = (memorypool *)0x0;
  this_01 = (tetgenmesh *)this->subsegs;
  memorypool::traversalinit((memorypool *)this_01);
  pppdVar3 = shellfacetraverse(this_01,this->subsegs);
  iVar7 = 0;
  while (pppdVar3 != (shellface *)0x0) {
    if (pppdVar3[snextpivot[snextpivot[0]] >> 1] < (shellface)0x8) {
      ppdVar1 = pppdVar3[sorgpivot[0]];
      ppdVar10 = pppdVar3[sdestpivot[0]];
      *(int *)((long)pppdVar3 + (long)this->shmarkindex * 4 + 8) = iVar7;
      piVar6 = snextpivot;
      while (pppdVar3 = (shellface *)((ulong)pppdVar3[*piVar6 >> 1] & 0xfffffffffffffff8),
            pppdVar3 != (shellface *)0x0) {
        *(int *)((long)pppdVar3 + (long)this->shmarkindex * 4 + 8) = iVar7;
        bVar12 = pppdVar3[sorgpivot[0]] != ppdVar10;
        ppdVar10 = pppdVar3[sdestpivot[bVar12]];
        piVar6 = snextpivot + bVar12;
      }
      this_01 = this_00;
      arraypool::newindex((arraypool *)this_00,&local_38);
      *local_38 = ppdVar1;
      local_38[1] = ppdVar10;
      iVar7 = iVar7 + 1;
    }
    pppdVar3 = shellfacetraverse(this_01,this->subsegs);
  }
  pmVar11 = this_00->tetrahedrons;
  if (this->b->verbose != 0) {
    printf("  Found %ld segments.\n",pmVar11);
  }
  pmVar9 = (memorypool *)0x0;
  ppdVar4 = (point *)operator_new__(-(ulong)(((ulong)pmVar11 & 0x7000000000000000) != 0) |
                                    (long)pmVar11 * 0x10);
  this->segmentendpointslist = ppdVar4;
  this->totalworkmemory = this->totalworkmemory + (long)pmVar11 * 0x10;
  if ((long)pmVar11 < 1) {
    pmVar11 = pmVar9;
  }
  for (pmVar5 = (memorypool *)0x0; pmVar11 != pmVar5;
      pmVar5 = (memorypool *)((long)&pmVar5->firstblock + 1)) {
    ptVar2 = (&this_00->bgm->in)[(uint)pmVar5 >> (*(byte *)&this_00->addin & 0x1f)];
    lVar8 = (long)*(int *)&this_00->in *
            (long)(int)(*(int *)((long)&this_00->addin + 4) & (uint)pmVar5);
    *(undefined8 *)((long)this->segmentendpointslist + (long)pmVar9) =
         *(undefined8 *)((long)&ptVar2->firstnumber + lVar8);
    *(undefined8 *)((long)(this->segmentendpointslist + 1) + (long)pmVar9) =
         *(undefined8 *)((long)&ptVar2->useindex + lVar8);
    pmVar9 = (memorypool *)&pmVar9->nextitem;
  }
  arraypool::~arraypool((arraypool *)this_00);
  operator_delete(this_00,0x30);
  return;
}

Assistant:

void tetgenmesh::makesegmentendpointsmap()
{
  arraypool *segptlist;
  face segloop, prevseg, nextseg;
  point eorg, edest, *parypt;
  int segindex = 0, idx = 0;
  int i;

  if (b->verbose > 0) {
    printf("  Creating the segment-endpoints map.\n");
  }

  segptlist = new arraypool(2 * sizeof(point), 10);

  // A segment s may have been split into many subsegments. Operate the one
  //   which contains the origin of s. Then mark the rest of subsegments.
  subsegs->traversalinit();
  segloop.sh = shellfacetraverse(subsegs);
  segloop.shver = 0;
  while (segloop.sh != NULL) {
    senext2(segloop, prevseg);
    spivotself(prevseg);
    if (prevseg.sh == NULL) {
      eorg = sorg(segloop);
      edest = sdest(segloop);
      setfacetindex(segloop, segindex);
      senext(segloop, nextseg);
      spivotself(nextseg);
      while (nextseg.sh != NULL) {
        setfacetindex(nextseg, segindex);
        nextseg.shver = 0;
        if (sorg(nextseg) != edest) sesymself(nextseg);
        edest = sdest(nextseg);
        // Go the next connected subsegment at edest.
        senextself(nextseg);
        spivotself(nextseg);
      }
      segptlist->newindex((void **) &parypt);
      parypt[0] = eorg;
      parypt[1] = edest;
      segindex++;
    }
    segloop.sh = shellfacetraverse(subsegs);
  }

  if (b->verbose) {
    printf("  Found %ld segments.\n", segptlist->objects);
  }

  segmentendpointslist = new point[segptlist->objects * 2];

  totalworkmemory += (segptlist->objects * 2) * sizeof(point *);

  for (i = 0; i < segptlist->objects; i++) {
    parypt = (point *) fastlookup(segptlist, i);
    segmentendpointslist[idx++] = parypt[0];
    segmentendpointslist[idx++] = parypt[1];
  }

  delete segptlist;
}